

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerCPP::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerCPP *this,Parameter *arg)

{
  uint32_t uVar1;
  SPIRType *type_00;
  SPIRVariable *pSVar2;
  ulong uVar3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  bool bVar5;
  char (*in_stack_fffffffffffffef8) [2];
  char *local_d0;
  string local_c8;
  string local_a8;
  uint local_88;
  uint32_t i;
  undefined1 local_78 [8];
  string variable_name;
  string base;
  SPIRVariable *var;
  bool constref;
  SPIRType *type;
  Parameter *arg_local;
  CompilerCPP *this_local;
  
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&arg->id);
  type_00 = Compiler::expression_type((Compiler *)this,uVar1);
  bVar5 = true;
  if ((type_00->pointer & 1U) != 0) {
    bVar5 = arg->write_count == 0;
  }
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&arg->id);
  pSVar2 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar1);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            ((undefined1 *)((long)&variable_name.field_2 + 8),this,type_00,0);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar2->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_78,this,(ulong)uVar1,1);
  Compiler::remap_variable_type_name
            ((Compiler *)this,type_00,(string *)local_78,
             (string *)((long)&variable_name.field_2 + 8));
  local_88 = 0;
  while( true ) {
    uVar3 = (ulong)local_88;
    sVar4 = VectorView<unsigned_int>::size(&(type_00->array).super_VectorView<unsigned_int>);
    if (sVar4 <= uVar3) break;
    CompilerGLSL::to_array_size_abi_cxx11_(&local_c8,&this->super_CompilerGLSL,type_00,local_88);
    in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6747b7;
    join<char_const(&)[12],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_a8,(spirv_cross *)"std::array<",
               (char (*) [12])((long)&variable_name.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6737c9,
               (char (*) [3])&local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6747b7,
               in_stack_fffffffffffffef8);
    ::std::__cxx11::string::operator=
              ((string *)(variable_name.field_2._M_local_buf + 8),(string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    local_88 = local_88 + 1;
  }
  local_d0 = "";
  if (bVar5) {
    local_d0 = "const ";
  }
  join<char_const*,std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&>
            (__return_storage_ptr__,(spirv_cross *)&local_d0,
             (char **)((long)&variable_name.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x673039,
             (char (*) [3])local_78,in_R9);
  ::std::__cxx11::string::~string((string *)local_78);
  ::std::__cxx11::string::~string((string *)(variable_name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string CompilerCPP::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &type = expression_type(arg.id);
	bool constref = !type.pointer || arg.write_count == 0;

	auto &var = get<SPIRVariable>(arg.id);

	string base = type_to_glsl(type);
	string variable_name = to_name(var.self);
	remap_variable_type_name(type, variable_name, base);

	for (uint32_t i = 0; i < type.array.size(); i++)
		base = join("std::array<", base, ", ", to_array_size(type, i), ">");

	return join(constref ? "const " : "", base, " &", variable_name);
}